

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

bool __thiscall QGridLayout::hasHeightForWidth(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  QGridLayoutPrivate *pQVar1;
  QGridLayoutPrivate *d;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  hSpacing = this_00->horizontalSpacing;
  pQVar1 = this_00;
  if (hSpacing < 0) {
    hSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutHorizontalSpacing);
    pQVar1 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  }
  vSpacing = pQVar1->verticalSpacing;
  if (vSpacing < 0) {
    vSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutVerticalSpacing);
  }
  QGridLayoutPrivate::setupLayoutData(this_00,hSpacing,vSpacing);
  return (bool)((this_00->field_0x194 & 8) >> 3);
}

Assistant:

bool QGridLayout::hasHeightForWidth() const
{
    return const_cast<QGridLayout*>(this)->d_func()->hasHeightForWidth(horizontalSpacing(), verticalSpacing());
}